

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall
duckdb::AlterViewInfo::AlterViewInfo(AlterViewInfo *this,AlterViewType type,AlterEntryData *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar1) {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_70._M_string_length = (data->catalog)._M_string_length;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_90._M_string_length = (data->schema)._M_string_length;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_50._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,ALTER_VIEW,&local_70,&local_90,&local_50,data->if_not_found);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AlterTableInfo_024920e0;
  (this->super_AlterInfo).field_0x71 = type;
  return;
}

Assistant:

AlterViewInfo::AlterViewInfo(AlterViewType type, AlterEntryData data)
    : AlterInfo(AlterType::ALTER_VIEW, std::move(data.catalog), std::move(data.schema), std::move(data.name),
                data.if_not_found),
      alter_view_type(type) {
}